

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O2

void __thiscall wasm::SuffixTree::setSuffixIndices(SuffixTree *this)

{
  uint Len;
  SuffixTreeNode *this_00;
  ret_type pSVar1;
  size_t sVar2;
  ret_type this_01;
  __node_base *p_Var3;
  pair<wasm::SuffixTreeNode_*,_unsigned_int> local_60;
  SuffixTree *local_50;
  undefined1 auStack_48 [8];
  vector<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
  ToVisit;
  
  ToVisit.
  super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_48 = (undefined1  [8])0x0;
  ToVisit.
  super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.first = &this->Root->super_SuffixTreeNode;
  local_60.second = 0;
  local_50 = this;
  std::
  vector<std::pair<wasm::SuffixTreeNode*,unsigned_int>,std::allocator<std::pair<wasm::SuffixTreeNode*,unsigned_int>>>
  ::emplace_back<std::pair<wasm::SuffixTreeNode*,unsigned_int>>
            ((vector<std::pair<wasm::SuffixTreeNode*,unsigned_int>,std::allocator<std::pair<wasm::SuffixTreeNode*,unsigned_int>>>
              *)auStack_48,&local_60);
  do {
    if (auStack_48 ==
        (undefined1  [8])
        ToVisit.
        super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      std::
      _Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
      ::~_Vector_base((_Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
                       *)auStack_48);
      return;
    }
    this_00 = ToVisit.
              super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start[-1].first;
    Len = ToVisit.
          super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start[-1].second;
    ToVisit.
    super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         ToVisit.
         super__Vector_base<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>,_std::allocator<std::pair<wasm::SuffixTreeNode_*,_unsigned_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start + -1;
    SuffixTreeNode::setConcatLen(this_00,Len);
    pSVar1 = llvm::dyn_cast<wasm::SuffixTreeInternalNode,wasm::SuffixTreeNode>(this_00);
    if (pSVar1 != (ret_type)0x0) {
      p_Var3 = &(pSVar1->Children)._M_h._M_before_begin;
      while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
        if (*(SuffixTreeNode **)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor ==
            (SuffixTreeNode *)0x0) {
          __assert_fail("ChildPair.second && \"Node had a null child!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/suffix_tree.cpp"
                        ,0x6c,"void wasm::SuffixTree::setSuffixIndices()");
        }
        sVar2 = numElementsInSubstring
                          (*(SuffixTreeNode **)
                            &((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor);
        local_60.first =
             *(SuffixTreeNode **)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor;
        local_60.second = (int)sVar2 + Len;
        std::
        vector<std::pair<wasm::SuffixTreeNode*,unsigned_int>,std::allocator<std::pair<wasm::SuffixTreeNode*,unsigned_int>>>
        ::emplace_back<std::pair<wasm::SuffixTreeNode*,unsigned_int>>
                  ((vector<std::pair<wasm::SuffixTreeNode*,unsigned_int>,std::allocator<std::pair<wasm::SuffixTreeNode*,unsigned_int>>>
                    *)auStack_48,&local_60);
      }
    }
    this_01 = llvm::dyn_cast<wasm::SuffixTreeLeafNode,wasm::SuffixTreeNode>(this_00);
    if (this_01 != (ret_type)0x0) {
      SuffixTreeLeafNode::setSuffixIdx
                (this_01,(int)((ulong)((long)(local_50->Str).
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(local_50->Str).
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 2) - Len);
    }
  } while( true );
}

Assistant:

void SuffixTree::setSuffixIndices() {
  // List of nodes we need to visit along with the current length of the
  // string.
  std::vector<std::pair<SuffixTreeNode*, unsigned>> ToVisit;

  // Current node being visited.
  SuffixTreeNode* CurrNode = Root;

  // Sum of the lengths of the nodes down the path to the current one.
  unsigned CurrNodeLen = 0;
  ToVisit.push_back({CurrNode, CurrNodeLen});
  while (!ToVisit.empty()) {
    std::tie(CurrNode, CurrNodeLen) = ToVisit.back();
    ToVisit.pop_back();
    // Length of the current node from the root down to here.
    CurrNode->setConcatLen(CurrNodeLen);
    if (auto* InternalNode = dyn_cast<SuffixTreeInternalNode>(CurrNode)) {
      for (auto& ChildPair : InternalNode->Children) {
        assert(ChildPair.second && "Node had a null child!");
        ToVisit.push_back(
          {ChildPair.second,
           CurrNodeLen + numElementsInSubstring(ChildPair.second)});
      }
    }
    // No children, so we are at the end of the string.
    if (auto* LeafNode = dyn_cast<SuffixTreeLeafNode>(CurrNode)) {
      LeafNode->setSuffixIdx(Str.size() - CurrNodeLen);
    }
  }
}